

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O2

bool __thiscall ProfileData::Start(ProfileData *this,char *fname,Options *options)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  Bucket *__s;
  Slot *pSVar4;
  bool bVar5;
  
  if (this->out_ < 0) {
    bVar5 = false;
    iVar1 = open(fname,0x241,0x1b6);
    if (-1 < iVar1) {
      tVar2 = time((time_t *)0x0);
      this->start_time_ = tVar2;
      pcVar3 = strdup(fname);
      this->fname_ = pcVar3;
      this->num_evicted_ = 0;
      this->count_ = 0;
      this->evictions_ = 0;
      this->total_bytes_ = 0;
      __s = (Bucket *)operator_new__(0x800000);
      this->hash_ = __s;
      pSVar4 = (Slot *)operator_new__(0x200000);
      this->evict_ = pSVar4;
      memset(__s,0,0x800000);
      *pSVar4 = 0;
      pSVar4[1] = 3;
      this->num_evicted_ = 3;
      pSVar4[2] = 0;
      if (options->frequency_ == 0) {
        fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/profiledata.cc"
                ,0x7b,"0","!=","options.frequency()");
        abort();
      }
      pSVar4[3] = (long)(int)(1000000 / (long)options->frequency_);
      this->num_evicted_ = 5;
      pSVar4[4] = 0;
      this->out_ = iVar1;
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ProfileData::Start(const char* fname,
                        const ProfileData::Options& options) {
  if (enabled()) {
    return false;
  }

  // Open output file and initialize various data structures
  int fd = open(fname, O_CREAT | O_WRONLY | O_TRUNC, 0666);
  if (fd < 0) {
    // Can't open outfile for write
    return false;
  }

  start_time_ = time(nullptr);
  fname_ = strdup(fname);

  // Reset counters
  num_evicted_ = 0;
  count_       = 0;
  evictions_   = 0;
  total_bytes_ = 0;

  hash_ = new Bucket[kBuckets];
  evict_ = new Slot[kBufferLength];
  memset(hash_, 0, sizeof(hash_[0]) * kBuckets);

  // Record special entries
  evict_[num_evicted_++] = 0;                     // count for header
  evict_[num_evicted_++] = 3;                     // depth for header
  evict_[num_evicted_++] = 0;                     // Version number
  CHECK_NE(0, options.frequency());
  int period = 1000000 / options.frequency();
  evict_[num_evicted_++] = period;                // Period (microseconds)
  evict_[num_evicted_++] = 0;                     // Padding

  out_ = fd;

  return true;
}